

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O3

int lws_buflist_linear_use(lws_buflist **head,uint8_t *buf,size_t len)

{
  lws_buflist *plVar1;
  uint8_t *__dest;
  ulong __n;
  
  plVar1 = *head;
  __dest = buf;
  if (len != 0 && plVar1 != (lws_buflist *)0x0) {
    do {
      __n = plVar1->len - plVar1->pos;
      if (len <= __n) {
        __n = len;
      }
      memcpy(__dest,(void *)((long)&plVar1[1].pos + plVar1->pos),__n);
      __dest = __dest + __n;
      lws_buflist_use_segment(head,__n);
      plVar1 = *head;
    } while ((plVar1 != (lws_buflist *)0x0) && (len = len - __n, len != 0));
  }
  return (int)__dest - (int)buf;
}

Assistant:

int
lws_buflist_linear_use(struct lws_buflist **head, uint8_t *buf, size_t len)
{
	uint8_t *obuf = buf;
	size_t s;

	while (*head && len) {
		s = (*head)->len - (*head)->pos;
		if (s > len)
			s = len;
		memcpy(buf, ((uint8_t *)((*head) + 1)) +
			    LWS_PRE + (*head)->pos, s);
		len -= s;
		buf += s;
		lws_buflist_use_segment(head, s);
	}

	return lws_ptr_diff(buf, obuf);
}